

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx2.cpp
# Opt level: O2

void ncnn::im2col_sgemm_pack1to4_int8_sse_avx2
               (Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Option *opt)

{
  uint uVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  int *piVar15;
  uint uVar16;
  long lVar17;
  undefined1 *puVar18;
  int iVar19;
  long lVar20;
  uint uVar21;
  long lVar22;
  ulong uVar23;
  undefined1 *puVar24;
  ulong uVar25;
  uint uVar26;
  long lVar27;
  ulong uVar28;
  undefined1 (*pauVar29) [16];
  ulong uVar30;
  int iVar31;
  ulong uVar32;
  size_t _elemsize;
  long lVar33;
  undefined1 (*pauVar34) [16];
  ulong *puVar35;
  long lVar36;
  undefined1 (*pauVar37) [16];
  int iVar38;
  long lVar39;
  long lVar40;
  bool bVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [64];
  undefined1 auVar49 [32];
  undefined1 auVar50 [64];
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [64];
  undefined1 auVar54 [32];
  undefined1 auVar55 [64];
  undefined1 auVar56 [32];
  undefined1 auVar57 [64];
  undefined1 auVar58 [32];
  undefined1 auVar59 [64];
  long local_108;
  undefined1 local_e8 [32];
  undefined1 local_c8 [64];
  size_t local_88;
  ulong local_80;
  ulong local_78;
  Mat *local_70;
  undefined1 local_68 [32];
  ulong local_40;
  Mat *local_38;
  
  uVar1 = bottom_im2col->w;
  uVar26 = bottom_im2col->h;
  local_80 = (ulong)uVar26;
  uVar2 = bottom_im2col->c;
  uVar32 = (ulong)(int)uVar2;
  local_40 = (ulong)(uint)top_blob->c;
  local_88 = 0;
  local_c8._0_8_ = (void *)0x0;
  local_c8._8_4_ = 0;
  local_c8._12_4_ = 0;
  local_c8._16_8_ = 0;
  local_c8._24_4_ = 0;
  local_c8._32_8_ = (Allocator *)0x0;
  local_c8._40_4_ = 0;
  local_c8._44_4_ = 0;
  local_c8._48_12_ = SUB1612((undefined1  [16])0x0,4);
  uVar16 = uVar1;
  if ((long)uVar32 < 4) {
    _elemsize = 1;
    iVar19 = 1;
    uVar21 = uVar2;
    if ((int)uVar1 < 4) {
      if (1 < (int)uVar1) {
        uVar26 = uVar26 * 2;
        uVar16 = (uVar1 & 1) + 1;
      }
    }
    else {
      uVar26 = uVar26 * 4;
      uVar16 = (uVar1 & 1) + (uVar1 >> 2) + (uint)((uVar1 >> 1 & 1) != 0);
    }
  }
  else {
    _elemsize = 4;
    if ((int)uVar1 < 4) {
      if ((int)uVar1 < 2) {
        uVar21 = (uVar2 & 3) + ((uint)(uVar32 >> 2) & 0x3fffffff);
      }
      else {
        uVar26 = uVar26 * 2;
        uVar21 = (uVar2 & 3) + ((uint)(uVar32 >> 2) & 0x3fffffff);
        uVar16 = (uVar1 & 1) + 1;
      }
    }
    else {
      uVar26 = uVar26 * 4;
      uVar21 = (uVar2 & 3) + ((uint)(uVar32 >> 2) & 0x3fffffff);
      uVar16 = (uVar1 & 1) + (uVar1 >> 2) + (uint)((uVar1 >> 1 & 1) != 0);
    }
    iVar19 = 4;
  }
  local_70 = kernel;
  local_38 = top_blob;
  Mat::create((Mat *)local_c8,uVar26,uVar21,uVar16,_elemsize,iVar19,opt->workspace_allocator);
  uVar28 = 0;
  iVar19 = (int)local_80;
  local_68._0_4_ = 0;
  if (0 < iVar19) {
    local_68._0_4_ = iVar19;
  }
  uVar30 = (ulong)(int)uVar1;
  uVar23 = (ulong)(uint)((int)uVar1 >> 2);
  if ((int)uVar1 >> 2 < 1) {
    uVar23 = uVar28;
  }
  local_108 = 3;
  for (; uVar28 != uVar23; uVar28 = uVar28 + 1) {
    puVar24 = (undefined1 *)(local_88 * uVar28 * local_c8._16_8_ + local_c8._0_8_);
    lVar33 = 2;
    lVar27 = 1;
    lVar22 = 3;
    for (uVar25 = 0; (long)(uVar25 | 3) < (long)uVar32; uVar25 = uVar25 + 4) {
      lVar36 = bottom_im2col->elemsize * bottom_im2col->cstep;
      lVar39 = lVar36 * uVar25;
      lVar40 = (long)bottom_im2col->data + local_108;
      lVar17 = lVar36 * lVar22;
      lVar20 = lVar36 * lVar27;
      lVar36 = lVar36 * lVar33;
      iVar31 = local_68._0_4_;
      while (bVar41 = iVar31 != 0, iVar31 = iVar31 + -1, bVar41) {
        *puVar24 = *(undefined1 *)(lVar40 + -3 + lVar39);
        puVar24[1] = *(undefined1 *)(lVar40 + -3 + lVar20);
        puVar24[2] = *(undefined1 *)(lVar40 + -3 + lVar36);
        puVar24[3] = *(undefined1 *)(lVar40 + -3 + lVar17);
        puVar24[4] = *(undefined1 *)(lVar40 + -2 + lVar39);
        puVar24[5] = *(undefined1 *)(lVar40 + -2 + lVar20);
        puVar24[6] = *(undefined1 *)(lVar40 + -2 + lVar36);
        puVar24[7] = *(undefined1 *)(lVar40 + -2 + lVar17);
        puVar24[8] = *(undefined1 *)(lVar40 + -1 + lVar39);
        puVar24[9] = *(undefined1 *)(lVar40 + -1 + lVar20);
        puVar24[10] = *(undefined1 *)(lVar40 + -1 + lVar36);
        puVar24[0xb] = *(undefined1 *)(lVar40 + -1 + lVar17);
        puVar24[0xc] = *(undefined1 *)(lVar40 + lVar39);
        puVar24[0xd] = *(undefined1 *)(lVar40 + lVar20);
        puVar24[0xe] = *(undefined1 *)(lVar40 + lVar36);
        puVar24[0xf] = *(undefined1 *)(lVar40 + lVar17);
        puVar24 = puVar24 + 0x10;
        lVar40 = lVar40 + uVar30;
      }
      lVar22 = lVar22 + 4;
      lVar27 = lVar27 + 4;
      lVar33 = lVar33 + 4;
    }
    for (; (long)uVar25 < (long)uVar32; uVar25 = uVar25 + 1) {
      puVar18 = (undefined1 *)
                ((long)bottom_im2col->data +
                uVar28 * 4 + bottom_im2col->cstep * uVar25 * bottom_im2col->elemsize);
      iVar31 = local_68._0_4_;
      while (bVar41 = iVar31 != 0, iVar31 = iVar31 + -1, bVar41) {
        *puVar24 = *puVar18;
        puVar24[1] = puVar18[1];
        puVar24[2] = puVar18[2];
        puVar24[3] = puVar18[3];
        puVar24 = puVar24 + 4;
        puVar18 = puVar18 + uVar30;
      }
    }
    local_108 = local_108 + 4;
  }
  local_78 = uVar30 & 0xfffffffffffffffc;
  uVar26 = uVar1 >> 1 & 1;
  local_108 = local_78 + 1;
  for (uVar28 = 0; uVar28 != uVar26; uVar28 = uVar28 + 1) {
    uVar23 = local_78 + uVar28 * 2;
    uVar25 = (ulong)(uint)((int)uVar23 >> 0x1f) << 0x20 | uVar23 & 0xffffffff;
    puVar24 = (undefined1 *)
              ((long)(((int)((long)uVar25 % 4) >> 1) + (int)((long)uVar25 / 4)) * local_88 *
               local_c8._16_8_ + local_c8._0_8_);
    lVar33 = 1;
    lVar27 = 2;
    lVar22 = 3;
    for (uVar25 = 0; (long)(uVar25 | 3) < (long)uVar32; uVar25 = uVar25 + 4) {
      lVar20 = bottom_im2col->elemsize * bottom_im2col->cstep;
      lVar17 = (long)bottom_im2col->data + local_108;
      iVar31 = local_68._0_4_;
      while (bVar41 = iVar31 != 0, iVar31 = iVar31 + -1, bVar41) {
        *puVar24 = *(undefined1 *)(lVar17 + -1 + lVar20 * uVar25);
        puVar24[1] = *(undefined1 *)(lVar17 + -1 + lVar20 * lVar33);
        puVar24[2] = *(undefined1 *)(lVar17 + -1 + lVar20 * lVar27);
        puVar24[3] = *(undefined1 *)(lVar17 + -1 + lVar20 * lVar22);
        puVar24[4] = *(undefined1 *)(lVar17 + lVar20 * uVar25);
        puVar24[5] = *(undefined1 *)(lVar17 + lVar20 * lVar33);
        puVar24[6] = *(undefined1 *)(lVar17 + lVar20 * lVar27);
        puVar24[7] = *(undefined1 *)(lVar17 + lVar20 * lVar22);
        puVar24 = puVar24 + 8;
        lVar17 = lVar17 + uVar30;
      }
      lVar22 = lVar22 + 4;
      lVar27 = lVar27 + 4;
      lVar33 = lVar33 + 4;
    }
    for (; (long)uVar25 < (long)uVar32; uVar25 = uVar25 + 1) {
      puVar18 = (undefined1 *)
                ((long)bottom_im2col->data +
                uVar23 + bottom_im2col->cstep * uVar25 * bottom_im2col->elemsize);
      iVar31 = local_68._0_4_;
      while (bVar41 = iVar31 != 0, iVar31 = iVar31 + -1, bVar41) {
        *puVar24 = *puVar18;
        puVar24[1] = puVar18[1];
        puVar24 = puVar24 + 2;
        puVar18 = puVar18 + uVar30;
      }
    }
    local_108 = local_108 + 2;
  }
  for (uVar28 = (ulong)(int)((int)local_78 + uVar26 * 2); (long)uVar28 < (long)uVar30;
      uVar28 = uVar28 + 1) {
    uVar26 = (int)uVar28 >> 0x1f;
    uVar23 = (ulong)uVar26 << 0x20 | uVar28 & 0xffffffff;
    puVar24 = (undefined1 *)
              ((long)((int)((long)((ulong)uVar26 << 0x20 | uVar28 & 0xffffffff) % 2) +
                      (int)((long)uVar23 / 4) + (int)(char)((char)((long)uVar23 % 4) / '\x02')) *
               local_88 * local_c8._16_8_ + local_c8._0_8_);
    lVar33 = 1;
    lVar27 = 2;
    lVar22 = 3;
    for (uVar23 = 0; (long)(uVar23 | 3) < (long)uVar32; uVar23 = uVar23 + 4) {
      lVar20 = bottom_im2col->elemsize * bottom_im2col->cstep;
      lVar17 = (long)bottom_im2col->data + uVar28;
      iVar31 = local_68._0_4_;
      while (bVar41 = iVar31 != 0, iVar31 = iVar31 + -1, bVar41) {
        *puVar24 = *(undefined1 *)(lVar17 + lVar20 * uVar23);
        puVar24[1] = *(undefined1 *)(lVar17 + lVar20 * lVar33);
        puVar24[2] = *(undefined1 *)(lVar17 + lVar20 * lVar27);
        puVar24[3] = *(undefined1 *)(lVar17 + lVar20 * lVar22);
        puVar24 = puVar24 + 4;
        lVar17 = lVar17 + uVar30;
      }
      lVar22 = lVar22 + 4;
      lVar27 = lVar27 + 4;
      lVar33 = lVar33 + 4;
    }
    for (; (long)uVar23 < (long)uVar32; uVar23 = uVar23 + 1) {
      puVar18 = (undefined1 *)
                ((long)bottom_im2col->data +
                uVar28 + bottom_im2col->cstep * uVar23 * bottom_im2col->elemsize);
      iVar31 = local_68._0_4_;
      while (bVar41 = iVar31 != 0, iVar31 = iVar31 + -1, bVar41) {
        *puVar24 = *puVar18;
        puVar24 = puVar24 + 1;
        puVar18 = puVar18 + uVar30;
      }
    }
  }
  iVar31 = ((int)uVar2 / 4) * iVar19;
  uVar26 = ((int)uVar2 % 4) * iVar19;
  uVar28 = 0;
  uVar32 = (ulong)uVar26;
  if ((int)uVar26 < 1) {
    uVar32 = uVar28;
  }
  uVar23 = local_40 & 0xffffffff;
  if ((int)local_40 < 1) {
    uVar23 = uVar28;
  }
  for (; uVar28 != uVar23; uVar28 = uVar28 + 1) {
    pauVar29 = (undefined1 (*) [16])
               (local_38->cstep * uVar28 * local_38->elemsize + (long)local_38->data);
    for (uVar25 = 0; iVar19 = (int)uVar32, (long)(uVar25 | 3) < (long)uVar30; uVar25 = uVar25 + 4) {
      pauVar34 = (undefined1 (*) [16])((uVar25 >> 2) * local_88 * local_c8._16_8_ + local_c8._0_8_);
      pauVar37 = (undefined1 (*) [16])
                 (local_70->cstep * uVar28 * local_70->elemsize + (long)local_70->data);
      if (iVar31 < 1) {
        auVar50 = ZEXT1664((undefined1  [16])0x0);
        auVar48 = ZEXT1664((undefined1  [16])0x0);
      }
      else {
        auVar55 = ZEXT1664((undefined1  [16])0x0);
        auVar57 = ZEXT1664((undefined1  [16])0x0);
        auVar59 = ZEXT1664((undefined1  [16])0x0);
        auVar48 = ZEXT1664((undefined1  [16])0x0);
        auVar53 = ZEXT1664((undefined1  [16])0x0);
        local_68 = ZEXT1632(ZEXT816(0));
        auVar50 = ZEXT1664((undefined1  [16])0x0);
        local_e8 = ZEXT1632(ZEXT816(0));
        iVar38 = iVar31;
        while( true ) {
          bVar41 = iVar38 == 0;
          iVar38 = iVar38 + -1;
          auVar52 = auVar53._0_32_;
          auVar49 = auVar50._0_32_;
          auVar47 = auVar48._0_32_;
          auVar58 = auVar59._0_32_;
          auVar54 = auVar55._0_32_;
          auVar56 = auVar57._0_32_;
          if (bVar41) break;
          auVar6 = vpmovsxbw_avx2(*pauVar34);
          auVar11 = vpermq_avx2(auVar6,0x50);
          auVar12 = vpermq_avx2(auVar6,0xfa);
          auVar7 = vpmovsxbw_avx2(*pauVar37);
          auVar13 = vpermq_avx2(auVar6,5);
          auVar14 = vpermq_avx2(auVar6,0xaf);
          auVar8 = vpmullw_avx2(auVar11,auVar7);
          auVar6 = vpmulhw_avx2(auVar11,auVar7);
          auVar9 = vpmullw_avx2(auVar13,auVar7);
          auVar11 = vpmulhw_avx2(auVar13,auVar7);
          auVar13 = vpmullw_avx2(auVar12,auVar7);
          auVar12 = vpmulhw_avx2(auVar12,auVar7);
          auVar10 = vpmullw_avx2(auVar14,auVar7);
          auVar7 = vpmulhw_avx2(auVar14,auVar7);
          auVar14 = vpunpcklwd_avx2(auVar8,auVar6);
          local_e8 = vpaddd_avx2(local_e8,auVar14);
          auVar14 = vpunpcklwd_avx2(auVar9,auVar11);
          local_68 = vpaddd_avx2(local_68,auVar14);
          auVar6 = vpunpckhwd_avx2(auVar8,auVar6);
          auVar52 = vpaddd_avx2(auVar6,auVar52);
          auVar53 = ZEXT3264(auVar52);
          auVar52 = vpunpckhwd_avx2(auVar9,auVar11);
          auVar47 = vpaddd_avx2(auVar52,auVar47);
          auVar48 = ZEXT3264(auVar47);
          auVar47 = vpunpcklwd_avx2(auVar13,auVar12);
          auVar47 = vpaddd_avx2(auVar47,auVar49);
          auVar50 = ZEXT3264(auVar47);
          auVar47 = vpunpcklwd_avx2(auVar10,auVar7);
          auVar47 = vpaddd_avx2(auVar58,auVar47);
          auVar59 = ZEXT3264(auVar47);
          auVar47 = vpunpckhwd_avx2(auVar13,auVar12);
          auVar47 = vpaddd_avx2(auVar56,auVar47);
          auVar57 = ZEXT3264(auVar47);
          auVar47 = vpunpckhwd_avx2(auVar10,auVar7);
          auVar47 = vpaddd_avx2(auVar54,auVar47);
          auVar55 = ZEXT3264(auVar47);
          pauVar34 = pauVar34 + 1;
          pauVar37 = pauVar37 + 1;
        }
        auVar7 = vpunpckldq_avx2(local_e8,local_68);
        auVar11 = vpunpckldq_avx2(auVar52,auVar47);
        auVar6 = vpunpckhdq_avx2(local_e8,local_68);
        auVar52 = vpunpckhdq_avx2(auVar52,auVar47);
        auVar12 = vpunpckldq_avx2(auVar49,auVar58);
        auVar8 = vpunpckldq_avx2(auVar56,auVar54);
        auVar58 = vpunpckhdq_avx2(auVar49,auVar58);
        auVar54 = vpunpckhdq_avx2(auVar56,auVar54);
        auVar47 = vpunpckhdq_avx2(auVar7,auVar11);
        auVar49 = vpermq_avx2(auVar47,0x9c);
        auVar47 = vpunpckldq_avx2(auVar7,auVar11);
        auVar47 = vpermq_avx2(auVar47,0x9c);
        auVar47 = vpaddd_avx2(auVar47,auVar49);
        auVar49 = vpunpckhdq_avx2(auVar6,auVar52);
        auVar56 = vpermq_avx2(auVar49,0x9c);
        auVar49 = vpunpckldq_avx2(auVar6,auVar52);
        auVar49 = vpermq_avx2(auVar49,0x9c);
        auVar49 = vpaddd_avx2(auVar56,auVar49);
        auVar47 = vpaddd_avx2(auVar47,auVar49);
        auVar48 = ZEXT3264(auVar47);
        auVar47 = vpunpckhdq_avx2(auVar12,auVar8);
        auVar49 = vpermq_avx2(auVar47,0x9c);
        auVar47 = vpunpckldq_avx2(auVar12,auVar8);
        auVar47 = vpermq_avx2(auVar47,0x9c);
        auVar47 = vpaddd_avx2(auVar47,auVar49);
        auVar49 = vpunpckhdq_avx2(auVar58,auVar54);
        auVar52 = vpermq_avx2(auVar49,0x9c);
        auVar49 = vpunpckldq_avx2(auVar58,auVar54);
        auVar49 = vpermq_avx2(auVar49,0x9c);
        auVar49 = vpaddd_avx2(auVar52,auVar49);
        auVar47 = vpaddd_avx2(auVar47,auVar49);
        auVar50 = ZEXT3264(auVar47);
      }
      auVar44 = auVar48._16_16_;
      auVar45 = auVar50._16_16_;
      lVar33 = 0;
      while( true ) {
        if (iVar19 == (int)lVar33) break;
        auVar51 = vpmovsxbw_avx(ZEXT216(*(ushort *)(*pauVar34 + lVar33 * 4)));
        auVar51 = vpshuflw_avx(auVar51,0x50);
        auVar43 = vpshufd_avx(auVar51,0x50);
        auVar51 = vpmovsxbw_avx(ZEXT216(*(ushort *)(*pauVar34 + lVar33 * 4 + 2)));
        auVar51 = vpshuflw_avx(auVar51,0x50);
        auVar46 = vpshufd_avx(auVar51,0x50);
        auVar51 = vpmovsxbw_avx(ZEXT416(*(uint *)(*pauVar37 + lVar33 * 4)));
        auVar51._8_8_ = auVar51._0_8_;
        auVar3 = vpmullw_avx(auVar51,auVar43);
        auVar43 = vpmulhw_avx(auVar43,auVar51);
        auVar4 = vpmullw_avx(auVar51,auVar46);
        auVar46 = vpmulhw_avx(auVar46,auVar51);
        auVar51 = vpunpcklwd_avx(auVar3,auVar43);
        auVar51 = vpaddd_avx(auVar51,auVar48._0_16_);
        auVar48 = ZEXT1664(auVar51);
        auVar51 = vpunpckhwd_avx(auVar3,auVar43);
        auVar44 = vpaddd_avx(auVar51,auVar44);
        auVar51 = vpunpcklwd_avx(auVar4,auVar46);
        auVar51 = vpaddd_avx(auVar51,auVar50._0_16_);
        auVar50 = ZEXT1664(auVar51);
        auVar51 = vpunpckhwd_avx(auVar4,auVar46);
        auVar45 = vpaddd_avx(auVar51,auVar45);
        lVar33 = lVar33 + 1;
      }
      *pauVar29 = auVar48._0_16_;
      pauVar29[1] = auVar44;
      pauVar29[2] = auVar50._0_16_;
      pauVar29[3] = auVar45;
      pauVar29 = pauVar29 + 4;
    }
    while (uVar26 = (uint)uVar25, (int)(uVar26 | 1) < (int)uVar1) {
      pauVar34 = (undefined1 (*) [16])
                 ((((uint)(uVar25 >> 2) & 0x3fffffff) + (uint)((uVar26 >> 1 & 1) != 0)) * local_88 *
                  local_c8._16_8_ + local_c8._0_8_);
      pauVar37 = (undefined1 (*) [16])
                 (local_70->cstep * uVar28 * local_70->elemsize + (long)local_70->data);
      auVar48 = ZEXT1664((undefined1  [16])0x0);
      if (0 < iVar31) {
        auVar50 = ZEXT1664((undefined1  [16])0x0);
        auVar53 = ZEXT1664((undefined1  [16])0x0);
        auVar55 = ZEXT1664((undefined1  [16])0x0);
        iVar38 = iVar31;
        while( true ) {
          bVar41 = iVar38 == 0;
          iVar38 = iVar38 + -1;
          auVar47 = auVar48._0_32_;
          auVar49 = auVar50._0_32_;
          auVar52 = auVar53._0_32_;
          auVar54 = auVar55._0_32_;
          if (bVar41) break;
          auVar56 = vpmovsxbw_avx2(*pauVar34);
          auVar58 = vpmovsxbw_avx2(*pauVar37);
          auVar7 = vpermq_avx2(auVar56,0x50);
          auVar11 = vpermq_avx2(auVar56,5);
          auVar6 = vpmullw_avx2(auVar7,auVar58);
          auVar56 = vpmulhw_avx2(auVar7,auVar58);
          auVar7 = vpmullw_avx2(auVar11,auVar58);
          auVar58 = vpmulhw_avx2(auVar11,auVar58);
          auVar11 = vpunpcklwd_avx2(auVar6,auVar56);
          auVar47 = vpaddd_avx2(auVar47,auVar11);
          auVar48 = ZEXT3264(auVar47);
          auVar47 = vpunpcklwd_avx2(auVar7,auVar58);
          auVar47 = vpaddd_avx2(auVar49,auVar47);
          auVar50 = ZEXT3264(auVar47);
          auVar47 = vpunpckhwd_avx2(auVar6,auVar56);
          auVar47 = vpaddd_avx2(auVar52,auVar47);
          auVar53 = ZEXT3264(auVar47);
          auVar47 = vpunpckhwd_avx2(auVar7,auVar58);
          auVar47 = vpaddd_avx2(auVar54,auVar47);
          auVar55 = ZEXT3264(auVar47);
          pauVar34 = (undefined1 (*) [16])(*pauVar34 + 8);
          pauVar37 = pauVar37 + 1;
        }
        auVar56 = vpunpckldq_avx2(auVar47,auVar49);
        auVar58 = vpunpckldq_avx2(auVar52,auVar54);
        auVar49 = vpunpckhdq_avx2(auVar47,auVar49);
        auVar52 = vpunpckhdq_avx2(auVar52,auVar54);
        auVar47 = vpunpckhdq_avx2(auVar56,auVar58);
        auVar54 = vpermq_avx2(auVar47,0x9c);
        auVar47 = vpunpckldq_avx2(auVar56,auVar58);
        auVar47 = vpermq_avx2(auVar47,0x9c);
        auVar47 = vpaddd_avx2(auVar47,auVar54);
        auVar54 = vpunpckhdq_avx2(auVar49,auVar52);
        auVar54 = vpermq_avx2(auVar54,0x9c);
        auVar49 = vpunpckldq_avx2(auVar49,auVar52);
        auVar49 = vpermq_avx2(auVar49,0x9c);
        auVar49 = vpaddd_avx2(auVar54,auVar49);
        auVar47 = vpaddd_avx2(auVar47,auVar49);
        auVar48 = ZEXT3264(auVar47);
      }
      auVar44 = auVar48._16_16_;
      for (lVar33 = 0; iVar19 != (int)lVar33; lVar33 = lVar33 + 1) {
        auVar45 = vpmovsxbw_avx(ZEXT216(*(ushort *)(*pauVar34 + lVar33 * 2)));
        auVar45 = vpshuflw_avx(auVar45,0x50);
        auVar51 = vpshufd_avx(auVar45,0x50);
        auVar45._8_8_ = 0;
        auVar45._0_8_ = *(ulong *)(*pauVar37 + lVar33 * 4);
        auVar45 = vpmovsxbw_avx(auVar45);
        auVar46._0_8_ = auVar45._0_8_;
        auVar46._8_8_ = auVar46._0_8_;
        auVar43 = vpmullw_avx(auVar51,auVar46);
        auVar51 = vpmulhw_avx(auVar51,auVar46);
        auVar45 = vpunpcklwd_avx(auVar43,auVar51);
        auVar45 = vpaddd_avx(auVar45,auVar48._0_16_);
        auVar48 = ZEXT1664(auVar45);
        auVar45 = vpunpckhwd_avx(auVar43,auVar51);
        auVar44 = vpaddd_avx(auVar45,auVar44);
      }
      *pauVar29 = auVar48._0_16_;
      pauVar29[1] = auVar44;
      pauVar29 = pauVar29 + 2;
      uVar25 = (ulong)(uVar26 + 2);
    }
    while (uVar26 = (uint)uVar25, (int)uVar26 < (int)uVar1) {
      puVar35 = (ulong *)(((uVar26 & 1) + ((uint)(uVar25 >> 2) & 0x3fffffff) +
                          (uint)((uVar26 >> 1 & 1) != 0)) * local_88 * local_c8._16_8_ +
                         local_c8._0_8_);
      pauVar34 = (undefined1 (*) [16])
                 (local_70->cstep * uVar28 * local_70->elemsize + (long)local_70->data);
      auVar48 = ZEXT1664((undefined1  [16])0x0);
      if (0 < iVar31) {
        auVar50 = ZEXT1664((undefined1  [16])0x0);
        auVar53 = ZEXT1664((undefined1  [16])0x0);
        auVar55 = ZEXT1664((undefined1  [16])0x0);
        iVar38 = iVar31;
        while( true ) {
          bVar41 = iVar38 == 0;
          iVar38 = iVar38 + -1;
          auVar44 = auVar48._0_16_;
          auVar45 = auVar50._0_16_;
          auVar51 = auVar53._0_16_;
          auVar43 = auVar55._0_16_;
          if (bVar41) break;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = *puVar35;
          auVar4 = vpmovsxbw_avx(auVar3);
          auVar46 = *pauVar34;
          auVar3 = vpcmpgtb_avx((undefined1  [16])0x0,auVar46);
          auVar5 = vpunpcklbw_avx(auVar46,auVar3);
          auVar3 = vpunpckhbw_avx(auVar46,auVar3);
          auVar42._0_8_ = auVar4._0_8_;
          auVar42._8_8_ = auVar42._0_8_;
          auVar4 = vpmullw_avx(auVar42,auVar5);
          auVar46 = vpmulhw_avx(auVar42,auVar5);
          auVar5 = vpmullw_avx(auVar42,auVar3);
          auVar3 = vpmulhw_avx(auVar42,auVar3);
          auVar42 = vpunpcklwd_avx(auVar4,auVar46);
          auVar44 = vpaddd_avx(auVar44,auVar42);
          auVar48 = ZEXT1664(auVar44);
          auVar44 = vpunpckhwd_avx(auVar4,auVar46);
          auVar44 = vpaddd_avx(auVar45,auVar44);
          auVar50 = ZEXT1664(auVar44);
          auVar44 = vpunpcklwd_avx(auVar5,auVar3);
          auVar44 = vpaddd_avx(auVar51,auVar44);
          auVar53 = ZEXT1664(auVar44);
          auVar44 = vpunpckhwd_avx(auVar5,auVar3);
          auVar44 = vpaddd_avx(auVar43,auVar44);
          auVar55 = ZEXT1664(auVar44);
          puVar35 = (ulong *)((long)puVar35 + 4);
          pauVar34 = pauVar34 + 1;
        }
        auVar46 = vpunpckldq_avx(auVar44,auVar45);
        auVar3 = vpunpckldq_avx(auVar51,auVar43);
        auVar45 = vpunpckhdq_avx(auVar44,auVar45);
        auVar51 = vpunpckhdq_avx(auVar51,auVar43);
        auVar43 = vpunpcklqdq_avx(auVar46,auVar3);
        auVar44 = vpunpckhqdq_avx(auVar46,auVar3);
        auVar44 = vpaddd_avx(auVar43,auVar44);
        auVar43 = vpunpcklqdq_avx(auVar45,auVar51);
        auVar45 = vpunpckhqdq_avx(auVar45,auVar51);
        auVar45 = vpaddd_avx(auVar45,auVar43);
        auVar44 = vpaddd_avx(auVar44,auVar45);
        auVar48 = ZEXT1664(auVar44);
      }
      for (lVar33 = 0; iVar19 != (int)lVar33; lVar33 = lVar33 + 1) {
        auVar43._0_2_ = (short)*(char *)((long)puVar35 + lVar33);
        auVar43._2_2_ = auVar43._0_2_;
        auVar43._4_2_ = auVar43._0_2_;
        auVar43._6_2_ = auVar43._0_2_;
        auVar43._8_2_ = auVar43._0_2_;
        auVar43._10_2_ = auVar43._0_2_;
        auVar43._12_2_ = auVar43._0_2_;
        auVar43._14_2_ = auVar43._0_2_;
        auVar44._8_8_ = 0;
        auVar44._0_8_ = *(ulong *)(*pauVar34 + lVar33 * 4);
        auVar44 = vpmovsxbw_avx(auVar44);
        auVar45 = vpmullw_avx(auVar43,auVar44);
        auVar44 = vpmulhw_avx(auVar43,auVar44);
        auVar44 = vpunpcklwd_avx(auVar45,auVar44);
        auVar44 = vpaddd_avx(auVar48._0_16_,auVar44);
        auVar48 = ZEXT1664(auVar44);
      }
      *pauVar29 = auVar48._0_16_;
      pauVar29 = pauVar29 + 1;
      uVar25 = (ulong)(uVar26 + 1);
    }
  }
  piVar15 = (int *)CONCAT44(local_c8._12_4_,local_c8._8_4_);
  if (piVar15 != (int *)0x0) {
    LOCK();
    *piVar15 = *piVar15 + -1;
    UNLOCK();
    if (*piVar15 == 0) {
      if ((Allocator *)local_c8._32_8_ == (Allocator *)0x0) {
        free((void *)local_c8._0_8_);
      }
      else {
        (*(*(_func_int ***)local_c8._32_8_)[3])();
      }
    }
  }
  return;
}

Assistant:

void im2col_sgemm_pack1to4_int8_sse_avx2(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Option& opt)
{
    im2col_sgemm_pack1to4_int8_sse(bottom_im2col, top_blob, kernel, opt);
}